

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O1

int phr_parse_response(char *buf_start,size_t len,int *minor_version,int *status,char **msg,
                      size_t *msg_len,phr_header *headers,size_t *num_headers,size_t last_len)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  size_t sVar8;
  char *pcVar9;
  int local_3c;
  size_t local_38;
  
  pcVar9 = buf_start + len;
  local_38 = *num_headers;
  *minor_version = -1;
  *status = 0;
  iVar5 = 0;
  *msg = (char *)0x0;
  *msg_len = 0;
  *num_headers = 0;
  if (last_len != 0) {
    pcVar4 = buf_start + (last_len - 3);
    if (last_len < 3) {
      pcVar4 = buf_start;
    }
    do {
      if (pcVar4 == pcVar9) {
        return -2;
      }
      pcVar6 = pcVar4 + 1;
      if (*pcVar4 == '\n') {
LAB_00106f81:
        iVar3 = iVar5 + 1;
      }
      else {
        iVar3 = 0;
        if (*pcVar4 == '\r') {
          if (pcVar6 == pcVar9) {
            return -2;
          }
          if (*pcVar6 != '\n') {
            return -1;
          }
          pcVar6 = pcVar4 + 2;
          goto LAB_00106f81;
        }
      }
      iVar5 = iVar3;
      pcVar4 = pcVar6;
    } while (iVar5 != 2);
  }
  pcVar4 = parse_http_version(buf_start,pcVar9,minor_version,&local_3c);
  if (pcVar4 != (char *)0x0) {
    if (*pcVar4 == ' ') {
      lVar7 = (long)pcVar9 - (long)pcVar4;
      pcVar4 = pcVar4 + 1;
      do {
        pcVar6 = pcVar4;
        if (pcVar6 == pcVar9) goto LAB_00106fda;
        cVar1 = *pcVar6;
        pcVar4 = pcVar6 + 1;
        lVar7 = lVar7 + -1;
      } while (cVar1 == ' ');
      if (lVar7 < 4) {
LAB_00106fda:
        local_3c = -2;
        goto LAB_001070c9;
      }
      if ((byte)(cVar1 - 0x3aU) < 0xf6) {
LAB_0010704c:
        local_3c = -1;
        bVar2 = false;
      }
      else {
        iVar5 = (uint)(byte)(cVar1 - 0x30) * 100;
        *status = iVar5;
        if ((byte)(*pcVar4 - 0x3aU) < 0xf6) {
          pcVar4 = pcVar6 + 2;
          goto LAB_0010704c;
        }
        iVar5 = iVar5 + (uint)(byte)(*pcVar4 * '\n' + 0x20);
        *status = iVar5;
        pcVar4 = pcVar6 + 3;
        if ((byte)(pcVar6[2] - 0x3aU) < 0xf6) goto LAB_0010704c;
        *status = iVar5 + (uint)(byte)(pcVar6[2] - 0x30);
        bVar2 = true;
      }
      if ((bVar2) &&
         (pcVar4 = get_token_to_eol(pcVar4,pcVar9,msg,msg_len,&local_3c), pcVar4 != (char *)0x0)) {
        sVar8 = *msg_len;
        if (sVar8 != 0) {
          pcVar6 = *msg;
          if (*pcVar6 != ' ') goto LAB_001070c1;
          do {
            sVar8 = sVar8 - 1;
            pcVar6 = pcVar6 + 1;
            *msg = pcVar6;
            *msg_len = sVar8;
          } while (*pcVar6 == ' ');
        }
        pcVar9 = parse_headers(pcVar4,pcVar9,headers,num_headers,local_38,&local_3c);
        goto LAB_001070cb;
      }
    }
    else {
LAB_001070c1:
      local_3c = -1;
    }
  }
LAB_001070c9:
  pcVar9 = (char *)0x0;
LAB_001070cb:
  if (pcVar9 != (char *)0x0) {
    local_3c = (int)pcVar9 - (int)buf_start;
  }
  return local_3c;
}

Assistant:

int phr_parse_response(const char *buf_start, size_t len, int *minor_version, int *status, const char **msg, size_t *msg_len,
                       struct phr_header *headers, size_t *num_headers, size_t last_len)
{
    const char *buf = buf_start, *buf_end = buf + len;
    size_t max_headers = *num_headers;
    int r;

    *minor_version = -1;
    *status = 0;
    *msg = NULL;
    *msg_len = 0;
    *num_headers = 0;

    /* if last_len != 0, check if the response is complete (a fast countermeasure
       against slowloris */
    if (last_len != 0 && is_complete(buf, buf_end, last_len, &r) == NULL) {
        return r;
    }

    if ((buf = parse_response(buf, buf_end, minor_version, status, msg, msg_len, headers, num_headers, max_headers, &r)) == NULL) {
        return r;
    }

    return (int)(buf - buf_start);
}